

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tabs.cxx
# Opt level: O0

void __thiscall Fl_Tabs::clear_tab_positions(Fl_Tabs *this)

{
  Fl_Tabs *this_local;
  
  if (this->tab_pos != (int *)0x0) {
    free(this->tab_pos);
    this->tab_pos = (int *)0x0;
  }
  if (this->tab_width != (int *)0x0) {
    free(this->tab_width);
    this->tab_width = (int *)0x0;
  }
  return;
}

Assistant:

void Fl_Tabs::clear_tab_positions() {
  if (tab_pos) {
    free(tab_pos);
    tab_pos = 0;
  }
  if (tab_width){
    free(tab_width);
    tab_width = 0;
  }
}